

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

s3pid_t mdef_phone_id(mdef_t *m,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos)

{
  ushort uVar1;
  int iVar2;
  ph_lc_t *ppVar3;
  ph_rc_t *ppVar4;
  short rc_00;
  uint uVar5;
  short lc_00;
  undefined6 in_register_00000032;
  uint uVar6;
  
  uVar6 = (uint)(ushort)lc;
  uVar5 = (uint)(ushort)rc;
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x12a,
                  "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
  }
  if (-1 < ci) {
    iVar2 = m->n_ciphone;
    if ((int)CONCAT62(in_register_00000032,ci) < iVar2) {
      do {
        lc_00 = (short)uVar6;
        if ((lc_00 < 0) || (uVar6 = (uint)lc_00, iVar2 <= (int)uVar6)) {
          __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,300,
                        "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                       );
        }
        rc_00 = (short)uVar5;
        if ((rc_00 < 0) || (iVar2 <= rc_00)) {
          __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x12d,
                        "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                       );
        }
        if (WORD_POSN_SINGLE < wpos) {
          __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x12e,
                        "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                       );
        }
        ppVar3 = find_ph_lc(m->wpos_ci_lclist[wpos][CONCAT62(in_register_00000032,ci) & 0xffffffff],
                            lc_00);
        if ((ppVar3 != (ph_lc_t *)0x0) &&
           (ppVar4 = find_ph_rc(ppVar3->rclist,rc_00), ppVar4 != (ph_rc_t *)0x0)) {
          return ppVar4->pid;
        }
        uVar1 = m->sil;
        if ((short)uVar1 < 0) {
          return -1;
        }
        if (m->ciphone[uVar6].filler != 0) {
          uVar6 = (uint)uVar1;
        }
        if (m->ciphone[(uint)(int)rc_00].filler != 0) {
          uVar5 = (uint)uVar1;
        }
      } while (((short)uVar6 != lc_00) || ((short)uVar5 != rc_00));
      return -1;
    }
  }
  __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,299,"s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
               );
}

Assistant:

s3pid_t
mdef_phone_id(mdef_t * m,
              s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    s3cipid_t newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (NOT_S3CIPID(m->sil))
            return BAD_S3PID;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return BAD_S3PID;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}